

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O3

bool cfd::core::MatchWallyTx(wally_tx *src,wally_tx *dest)

{
  uchar *bytes_out;
  uchar *bytes_out_00;
  CfdException *pCVar1;
  value_type_conflict *__val;
  value_type_conflict *__val_1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int ret;
  int local_54;
  undefined1 local_50 [32];
  
  bytes_out = (uchar *)operator_new(0x20);
  bytes_out[0] = '\0';
  bytes_out[1] = '\0';
  bytes_out[2] = '\0';
  bytes_out[3] = '\0';
  bytes_out[4] = '\0';
  bytes_out[5] = '\0';
  bytes_out[6] = '\0';
  bytes_out[7] = '\0';
  bytes_out[8] = '\0';
  bytes_out[9] = '\0';
  bytes_out[10] = '\0';
  bytes_out[0xb] = '\0';
  bytes_out[0xc] = '\0';
  bytes_out[0xd] = '\0';
  bytes_out[0xe] = '\0';
  bytes_out[0xf] = '\0';
  bytes_out[0x10] = '\0';
  bytes_out[0x11] = '\0';
  bytes_out[0x12] = '\0';
  bytes_out[0x13] = '\0';
  bytes_out[0x14] = '\0';
  bytes_out[0x15] = '\0';
  bytes_out[0x16] = '\0';
  bytes_out[0x17] = '\0';
  bytes_out[0x18] = '\0';
  bytes_out[0x19] = '\0';
  bytes_out[0x1a] = '\0';
  bytes_out[0x1b] = '\0';
  bytes_out[0x1c] = '\0';
  bytes_out[0x1d] = '\0';
  bytes_out[0x1e] = '\0';
  bytes_out[0x1f] = '\0';
  bytes_out_00 = (uchar *)operator_new(0x20);
  bytes_out_00[0x10] = '\0';
  bytes_out_00[0x11] = '\0';
  bytes_out_00[0x12] = '\0';
  bytes_out_00[0x13] = '\0';
  bytes_out_00[0x14] = '\0';
  bytes_out_00[0x15] = '\0';
  bytes_out_00[0x16] = '\0';
  bytes_out_00[0x17] = '\0';
  bytes_out_00[0x18] = '\0';
  bytes_out_00[0x19] = '\0';
  bytes_out_00[0x1a] = '\0';
  bytes_out_00[0x1b] = '\0';
  bytes_out_00[0x1c] = '\0';
  bytes_out_00[0x1d] = '\0';
  bytes_out_00[0x1e] = '\0';
  bytes_out_00[0x1f] = '\0';
  bytes_out_00[0] = '\0';
  bytes_out_00[1] = '\0';
  bytes_out_00[2] = '\0';
  bytes_out_00[3] = '\0';
  bytes_out_00[4] = '\0';
  bytes_out_00[5] = '\0';
  bytes_out_00[6] = '\0';
  bytes_out_00[7] = '\0';
  bytes_out_00[8] = '\0';
  bytes_out_00[9] = '\0';
  bytes_out_00[10] = '\0';
  bytes_out_00[0xb] = '\0';
  bytes_out_00[0xc] = '\0';
  bytes_out_00[0xd] = '\0';
  bytes_out_00[0xe] = '\0';
  bytes_out_00[0xf] = '\0';
  local_54 = wally_tx_get_txid(src,bytes_out,0x20);
  if (local_54 != 0) {
    local_50._0_8_ = "cfdcore_psbt.cpp";
    local_50._8_4_ = 0x148;
    local_50._16_8_ = "MatchWallyTx";
    logger::log<int&>((CfdSourceLocation *)local_50,kCfdLogLevelWarning,"wally_tx_get_txid NG[{}]",
                      &local_54);
    pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
    local_50._0_8_ = local_50 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"psbt get txid error.","");
    CfdException::CfdException(pCVar1,kCfdIllegalArgumentError,(string *)local_50);
    __cxa_throw(pCVar1,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_54 = wally_tx_get_txid(dest,bytes_out_00,0x20);
  if (local_54 == 0) {
    auVar3[0] = -(*bytes_out_00 == *bytes_out);
    auVar3[1] = -(bytes_out_00[1] == bytes_out[1]);
    auVar3[2] = -(bytes_out_00[2] == bytes_out[2]);
    auVar3[3] = -(bytes_out_00[3] == bytes_out[3]);
    auVar3[4] = -(bytes_out_00[4] == bytes_out[4]);
    auVar3[5] = -(bytes_out_00[5] == bytes_out[5]);
    auVar3[6] = -(bytes_out_00[6] == bytes_out[6]);
    auVar3[7] = -(bytes_out_00[7] == bytes_out[7]);
    auVar3[8] = -(bytes_out_00[8] == bytes_out[8]);
    auVar3[9] = -(bytes_out_00[9] == bytes_out[9]);
    auVar3[10] = -(bytes_out_00[10] == bytes_out[10]);
    auVar3[0xb] = -(bytes_out_00[0xb] == bytes_out[0xb]);
    auVar3[0xc] = -(bytes_out_00[0xc] == bytes_out[0xc]);
    auVar3[0xd] = -(bytes_out_00[0xd] == bytes_out[0xd]);
    auVar3[0xe] = -(bytes_out_00[0xe] == bytes_out[0xe]);
    auVar3[0xf] = -(bytes_out_00[0xf] == bytes_out[0xf]);
    auVar2[0] = -(bytes_out_00[0x10] == bytes_out[0x10]);
    auVar2[1] = -(bytes_out_00[0x11] == bytes_out[0x11]);
    auVar2[2] = -(bytes_out_00[0x12] == bytes_out[0x12]);
    auVar2[3] = -(bytes_out_00[0x13] == bytes_out[0x13]);
    auVar2[4] = -(bytes_out_00[0x14] == bytes_out[0x14]);
    auVar2[5] = -(bytes_out_00[0x15] == bytes_out[0x15]);
    auVar2[6] = -(bytes_out_00[0x16] == bytes_out[0x16]);
    auVar2[7] = -(bytes_out_00[0x17] == bytes_out[0x17]);
    auVar2[8] = -(bytes_out_00[0x18] == bytes_out[0x18]);
    auVar2[9] = -(bytes_out_00[0x19] == bytes_out[0x19]);
    auVar2[10] = -(bytes_out_00[0x1a] == bytes_out[0x1a]);
    auVar2[0xb] = -(bytes_out_00[0x1b] == bytes_out[0x1b]);
    auVar2[0xc] = -(bytes_out_00[0x1c] == bytes_out[0x1c]);
    auVar2[0xd] = -(bytes_out_00[0x1d] == bytes_out[0x1d]);
    auVar2[0xe] = -(bytes_out_00[0x1e] == bytes_out[0x1e]);
    auVar2[0xf] = -(bytes_out_00[0x1f] == bytes_out[0x1f]);
    auVar2 = auVar2 & auVar3;
    operator_delete(bytes_out_00);
    operator_delete(bytes_out);
    return (ushort)((ushort)(SUB161(auVar2 >> 7,0) & 1) | (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1
                    | (ushort)(SUB161(auVar2 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar2 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar2 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar2 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar2 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar2 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar2 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar2 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar2 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar2 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar2 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar2 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar2 >> 0x77,0) & 1) << 0xe |
                   (ushort)(byte)(auVar2[0xf] >> 7) << 0xf) == 0xffff;
  }
  local_50._0_8_ = "cfdcore_psbt.cpp";
  local_50._8_4_ = 0x14d;
  local_50._16_8_ = "MatchWallyTx";
  logger::log<int&>((CfdSourceLocation *)local_50,kCfdLogLevelWarning,"wally_tx_get_txid NG[{}]",
                    &local_54);
  pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
  local_50._0_8_ = local_50 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"psbt get txid error.","");
  CfdException::CfdException(pCVar1,kCfdIllegalArgumentError,(string *)local_50);
  __cxa_throw(pCVar1,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

bool MatchWallyTx(struct wally_tx *src, struct wally_tx *dest) {
  std::vector<uint8_t> src_txid(WALLY_TXHASH_LEN);
  std::vector<uint8_t> dest_txid(WALLY_TXHASH_LEN);
  int ret = wally_tx_get_txid(src, src_txid.data(), src_txid.size());
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_get_txid NG[{}]", ret);
    throw CfdException(kCfdIllegalArgumentError, "psbt get txid error.");
  }
  ret = wally_tx_get_txid(dest, dest_txid.data(), dest_txid.size());
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_get_txid NG[{}]", ret);
    throw CfdException(kCfdIllegalArgumentError, "psbt get txid error.");
  }
  return (src_txid == dest_txid);
}